

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O2

QString * __thiscall QUndoStack::redoText(QString *__return_storage_ptr__,QUndoStack *this)

{
  long lVar1;
  
  lVar1 = *(long *)&this->field_0x8;
  if ((*(long *)(lVar1 + 0xa0) == 0) && ((long)*(int *)(lVar1 + 0xa8) < *(long *)(lVar1 + 0x88))) {
    QUndoCommand::actionText
              (__return_storage_ptr__,
               *(QUndoCommand **)(*(long *)(lVar1 + 0x80) + (long)*(int *)(lVar1 + 0xa8) * 8));
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QUndoStack::redoText() const
{
    Q_D(const QUndoStack);
    if (!d->macro_stack.isEmpty())
        return QString();
    if (d->index < d->command_list.size())
        return d->command_list.at(d->index)->actionText();
    return QString();
}